

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ImGuiContext *ctx;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (w_full <= 0.0) {
    w_full = CalcItemWidth();
  }
  iVar9 = components + -1;
  fVar13 = (pIVar6->Style).ItemInnerSpacing.x;
  fVar11 = (float)(int)((w_full - fVar13 * (float)iVar9) / (float)components);
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar11 = (float)(int)(w_full - (fVar13 + fVar12) * (float)iVar9);
  fVar13 = 1.0;
  if (1.0 <= fVar11) {
    fVar13 = fVar11;
  }
  iVar10 = (pIVar4->DC).ItemWidthStack.Size;
  iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    if (iVar3 < iVar10) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
      if (pfVar5 != (float *)0x0) {
        memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
        pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
        if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
      }
      (pIVar4->DC).ItemWidthStack.Data = pfVar7;
      (pIVar4->DC).ItemWidthStack.Capacity = iVar10;
    }
  }
  (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = fVar13;
  pIVar2 = &(pIVar4->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if (1 < components) {
    do {
      iVar10 = (pIVar4->DC).ItemWidthStack.Size;
      iVar3 = (pIVar4->DC).ItemWidthStack.Capacity;
      if (iVar10 == iVar3) {
        if (iVar3 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar3 / 2 + iVar3;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar3 < iVar10) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
          pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
          if (pfVar5 != (float *)0x0) {
            memcpy(pfVar7,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
            pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
            if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
          }
          (pIVar4->DC).ItemWidthStack.Data = pfVar7;
          (pIVar4->DC).ItemWidthStack.Capacity = iVar10;
        }
      }
      (pIVar4->DC).ItemWidthStack.Data[(pIVar4->DC).ItemWidthStack.Size] = fVar12;
      pIVar2 = &(pIVar4->DC).ItemWidthStack;
      pIVar2->Size = pIVar2->Size + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  (pIVar4->DC).ItemWidth =
       (pIVar4->DC).ItemWidthStack.Data[(long)(pIVar4->DC).ItemWidthStack.Size + -1];
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}